

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O3

void Abc_ObjPatchFanin(Abc_Obj_t *pObj,Abc_Obj_t *pFaninOld,Abc_Obj_t *pFaninNew)

{
  Mem_Step_t *p;
  int *pEntry;
  char *pcVar1;
  Abc_Ntk_t *pAVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  Abc_Obj_t *pAVar8;
  bool bVar9;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanio.c"
                  ,0xb0,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (((ulong)pFaninOld & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pFaninOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanio.c"
                  ,0xb1,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  pAVar8 = (Abc_Obj_t *)((ulong)pFaninNew & 0xfffffffffffffffe);
  if (pAVar8 == pFaninOld) {
    __assert_fail("pFaninOld != pFaninNewR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanio.c"
                  ,0xb2,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  pAVar2 = pObj->pNtk;
  if (pAVar2 != pFaninOld->pNtk) {
    __assert_fail("pObj->pNtk == pFaninOld->pNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanio.c"
                  ,0xb5,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (pAVar2 != pAVar8->pNtk) {
    __assert_fail("pObj->pNtk == pFaninNewR->pNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanio.c"
                  ,0xb6,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  iVar5 = (pObj->vFanins).nSize;
  if (0 < (long)iVar5) {
    piVar3 = (pObj->vFanins).pArray;
    uVar6 = 0;
    do {
      if (piVar3[uVar6] == pFaninOld->Id) {
        if (iVar5 <= (int)uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar3[uVar6] = pAVar8->Id;
        if (((ulong)pFaninNew & 1) != 0) {
          if (1 < uVar6) {
            __assert_fail("i >=0 && i < 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                          ,0x17e,"void Abc_ObjXorFaninC(Abc_Obj_t *, int)");
          }
          *(uint *)&pObj->field_0x14 =
               *(uint *)&pObj->field_0x14 ^ (uint)(uVar6 != 0) * 0x400 + 0x400;
        }
        iVar5 = (pFaninOld->vFanouts).nSize;
        if ((long)iVar5 < 1) {
          if (iVar5 != 0) {
            __assert_fail("i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x3c1,"int Vec_IntRemove(Vec_Int_t *, int)");
          }
          goto LAB_001c775f;
        }
        piVar3 = (pFaninOld->vFanouts).pArray;
        lVar4 = 1;
        goto LAB_001c773f;
      }
      uVar6 = uVar6 + 1;
    } while ((long)iVar5 != uVar6);
  }
  pcVar1 = Abc_ObjName(pFaninOld);
  printf("Node %s is not among",pcVar1);
  pcVar1 = Abc_ObjName(pObj);
  printf(" the fanins of node %s...\n",pcVar1);
  return;
  while (bVar9 = lVar4 != iVar5, lVar4 = lVar4 + 1, bVar9) {
LAB_001c773f:
    if (piVar3[lVar4 + -1] == pObj->Id) {
      if ((int)lVar4 < iVar5) {
        do {
          piVar3[lVar4 + -1] = piVar3[lVar4];
          lVar4 = lVar4 + 1;
          iVar5 = (pFaninOld->vFanouts).nSize;
        } while ((int)lVar4 < iVar5);
      }
      (pFaninOld->vFanouts).nSize = iVar5 + -1;
      goto LAB_001c77b2;
    }
  }
LAB_001c775f:
  pcVar1 = Abc_ObjName(pObj);
  printf("Node %s is not among",pcVar1);
  pcVar1 = Abc_ObjName(pFaninOld);
  printf(" the fanouts of its old fanin %s...\n",pcVar1);
  pAVar2 = pObj->pNtk;
LAB_001c77b2:
  iVar5 = pObj->Id;
  iVar7 = (pAVar8->vFanouts).nSize;
  if (iVar7 == (pAVar8->vFanouts).nCap) {
    p = pAVar2->pMmStep;
    if (iVar7 == 0) {
      (pAVar8->vFanouts).nCap = 1;
      iVar7 = 1;
    }
    if (p == (Mem_Step_t *)0x0) {
      piVar3 = (int *)malloc((long)(iVar7 * 2) << 2);
    }
    else {
      piVar3 = (int *)Mem_StepEntryFetch(p,iVar7 << 3);
    }
    pEntry = (pAVar8->vFanouts).pArray;
    if (pEntry != (int *)0x0) {
      if (0 < (pAVar8->vFanouts).nSize) {
        lVar4 = 0;
        do {
          piVar3[lVar4] = pEntry[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 < (pAVar8->vFanouts).nSize);
      }
      if (p == (Mem_Step_t *)0x0) {
        free(pEntry);
      }
      else {
        Mem_StepEntryRecycle(p,(char *)pEntry,(pAVar8->vFanouts).nCap << 2);
      }
    }
    (pAVar8->vFanouts).nCap = (pAVar8->vFanouts).nCap << 1;
    (pAVar8->vFanouts).pArray = piVar3;
    iVar7 = (pAVar8->vFanouts).nSize;
  }
  else {
    piVar3 = (pAVar8->vFanouts).pArray;
  }
  (pAVar8->vFanouts).nSize = iVar7 + 1;
  piVar3[iVar7] = iVar5;
  return;
}

Assistant:

void Abc_ObjPatchFanin( Abc_Obj_t * pObj, Abc_Obj_t * pFaninOld, Abc_Obj_t * pFaninNew )
{
    Abc_Obj_t * pFaninNewR = Abc_ObjRegular(pFaninNew);
    int iFanin;//, nLats;//, fCompl;
    assert( !Abc_ObjIsComplement(pObj) );
    assert( !Abc_ObjIsComplement(pFaninOld) );
    assert( pFaninOld != pFaninNewR );
//    assert( pObj != pFaninOld );
//    assert( pObj != pFaninNewR );
    assert( pObj->pNtk == pFaninOld->pNtk );
    assert( pObj->pNtk == pFaninNewR->pNtk );
    if ( (iFanin = Vec_IntFind( &pObj->vFanins, pFaninOld->Id )) == -1 )
    {
        printf( "Node %s is not among", Abc_ObjName(pFaninOld) );
        printf( " the fanins of node %s...\n", Abc_ObjName(pObj) );
        return;
    }

    // remember the attributes of the old fanin
//    fCompl = Abc_ObjFaninC(pObj, iFanin);
    // replace the old fanin entry by the new fanin entry (removes attributes)
    Vec_IntWriteEntry( &pObj->vFanins, iFanin, pFaninNewR->Id );
    // set the attributes of the new fanin
//    if ( fCompl ^ Abc_ObjIsComplement(pFaninNew) )
//        Abc_ObjSetFaninC( pObj, iFanin );
    if ( Abc_ObjIsComplement(pFaninNew) )
        Abc_ObjXorFaninC( pObj, iFanin );

//    if ( Abc_NtkIsSeq(pObj->pNtk) && (nLats = Seq_ObjFaninL(pObj, iFanin)) )
//        Seq_ObjSetFaninL( pObj, iFanin, nLats );
    // update the fanout of the fanin
    if ( !Vec_IntRemove( &pFaninOld->vFanouts, pObj->Id ) )
    {
        printf( "Node %s is not among", Abc_ObjName(pObj) );
        printf( " the fanouts of its old fanin %s...\n", Abc_ObjName(pFaninOld) );
//        return;
    }
    Vec_IntPushMem( pObj->pNtk->pMmStep, &pFaninNewR->vFanouts, pObj->Id );
}